

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dns.cpp
# Opt level: O2

bool __thiscall xmrig::Dns::resolve(Dns *this,String *host)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  EVP_PKEY_CTX *src;
  
  bVar2 = String::operator!=(&this->m_host,host);
  if (bVar2) {
    String::copy(&this->m_host,(EVP_PKEY_CTX *)host,src);
    clear(this);
  }
  uVar1 = uv_default_loop();
  iVar3 = uv_getaddrinfo(uVar1,this->m_resolver,onResolved,(this->m_host).m_data,0,this);
  this->m_status = iVar3;
  return iVar3 == 0;
}

Assistant:

bool xmrig::Dns::resolve(const String &host)
{
    if (m_host != host) {
        m_host = host;

        clear();
    }

    m_status = uv_getaddrinfo(uv_default_loop(), m_resolver, Dns::onResolved, m_host.data(), nullptr, &m_hints);

    return m_status == 0;
}